

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmimedata.cpp
# Opt level: O2

QString * __thiscall QMimeData::text(QString *__return_storage_ptr__,QMimeData *this)

{
  QMimeDataPrivate *this_00;
  bool bVar1;
  long in_FS_OFFSET;
  QMetaType local_80;
  QArrayDataPointer<char16_t> local_78;
  QMetaType local_60;
  anon_union_24_3_e3d07ef4_for_data local_58;
  undefined1 *puStack_40;
  anon_union_24_3_e3d07ef4_for_data local_38;
  undefined1 *puStack_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QMimeDataPrivate *)(this->super_QObject).d_ptr.d;
  local_38._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  puStack_20 = &DAT_aaaaaaaaaaaaaaaa;
  local_38.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
  local_38._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  textPlainUtf8Literal();
  QMetaType::QMetaType(&local_60,10);
  QMimeDataPrivate::retrieveTypedData((QVariant *)&local_38,this_00,(QString *)&local_58,local_60);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_58);
  bVar1 = ::QVariant::isNull((QVariant *)&local_38);
  if (bVar1) {
    local_58._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
    local_58.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
    local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    textPlainLiteral();
    QMetaType::QMetaType(&local_80,10);
    QMimeDataPrivate::retrieveTypedData((QVariant *)&local_58,this_00,(QString *)&local_78,local_80)
    ;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
    ::QVariant::toString(__return_storage_ptr__,(QVariant *)&local_58);
    ::QVariant::~QVariant((QVariant *)&local_58);
  }
  else {
    ::QVariant::toString(__return_storage_ptr__,(QVariant *)&local_38);
  }
  ::QVariant::~QVariant((QVariant *)&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QMimeData::text() const
{
    Q_D(const QMimeData);
    QVariant utf8Text = d->retrieveTypedData(textPlainUtf8Literal(), QMetaType(QMetaType::QString));
    if (!utf8Text.isNull())
        return utf8Text.toString();

    QVariant data = d->retrieveTypedData(textPlainLiteral(), QMetaType(QMetaType::QString));
    return data.toString();
}